

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O2

void re2::RegexpNamedCaptures(void)

{
  bool bVar1;
  int iVar2;
  Regexp *this;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__y;
  mapped_type *pmVar3;
  allocator local_1e1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  want;
  RegexpStatus status;
  LogMessageFatal local_190;
  
  status.code_ = kRegexpSuccess;
  status.error_arg_.ptr_ = (char *)0x0;
  status.error_arg_.length_ = 0;
  status.tmp_ = (string *)0x0;
  local_190.super_LogMessage._0_8_ = "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)";
  local_190.super_LogMessage._8_4_ = 0x23;
  this = Regexp::Parse((StringPiece *)&local_190,PerlX,&status);
  if (status.code_ != kRegexpSuccess) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x30);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: status.ok()");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  iVar2 = Regexp::NumCaptures(this);
  if (iVar2 != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x31);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (4) == (x->NumCaptures())");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  __y = &Regexp::NamedCaptures_abi_cxx11_(this)->_M_t;
  if (__y == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x33);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: have != NULL");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  if ((__y->_M_impl).super__Rb_tree_header._M_node_count != 2) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x34);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (2) == (have->size())");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &want._M_t._M_impl.super__Rb_tree_header._M_header;
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  want._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  want._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       want._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_190,"g1",&local_1e1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&want,(key_type *)&local_190);
  *pmVar3 = 1;
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_190,"g2",&local_1e1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&want,(key_type *)&local_190);
  *pmVar3 = 3;
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = std::operator==(&want._M_t,__y);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x39);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (want) == (*have)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  Regexp::Decref(this);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(__y);
  operator_delete(__y);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&want._M_t);
  RegexpStatus::~RegexpStatus(&status);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}